

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void Assimp::FBX::Node::WritePropertyNode<std::__cxx11::string>
               (string *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               StreamWriterLE *s,bool binary,int indent)

{
  FBXExportProperty local_d8;
  undefined1 local_b8 [8];
  Node node;
  FBXExportProperty p;
  int indent_local;
  bool binary_local;
  StreamWriterLE *s_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *name_local;
  
  FBX::FBXExportProperty::FBXExportProperty((FBXExportProperty *)&node.property_start,value,false);
  FBX::FBXExportProperty::FBXExportProperty(&local_d8,(FBXExportProperty *)&node.property_start);
  Node<Assimp::FBX::FBXExportProperty>((Node *)local_b8,name,&local_d8);
  FBX::FBXExportProperty::~FBXExportProperty(&local_d8);
  Dump((Node *)local_b8,s,binary,indent);
  ~Node((Node *)local_b8);
  FBX::FBXExportProperty::~FBXExportProperty((FBXExportProperty *)&node.property_start);
  return;
}

Assistant:

static void WritePropertyNode(
        const std::string& name,
        const T value,
        Assimp::StreamWriterLE& s,
        bool binary, int indent
    ) {
        FBX::FBXExportProperty p(value);
        FBX::Node node(name, p);
        node.Dump(s, binary, indent);
    }